

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFloatStateQueryTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Functional::FloatStateQueryTests::init(FloatStateQueryTests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  int iVar2;
  GetBooleanVerifier *pGVar3;
  undefined4 extraout_var;
  GetIntegerVerifier *this_00;
  undefined4 extraout_var_00;
  GetInteger64Verifier *this_01;
  undefined4 extraout_var_01;
  GetFloatVerifier *this_02;
  undefined4 extraout_var_02;
  ApiCase *pAVar4;
  allocator<char> local_a1;
  long local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  GetBooleanVerifier *local_58;
  GetIntegerVerifier *pGStack_50;
  GetInteger64Verifier *local_48;
  GetFloatVerifier *local_40;
  
  pGVar3 = (GetBooleanVerifier *)operator_new(0x28);
  iVar2 = (*((this->super_TestCaseGroup).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  FloatStateQueryVerifiers::GetBooleanVerifier::GetBooleanVerifier
            (pGVar3,(Functions *)CONCAT44(extraout_var,iVar2),
             ((this->super_TestCaseGroup).m_context)->m_testCtx->m_log);
  this->m_verifierBoolean = pGVar3;
  this_00 = (GetIntegerVerifier *)operator_new(0x28);
  iVar2 = (*((this->super_TestCaseGroup).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  FloatStateQueryVerifiers::GetIntegerVerifier::GetIntegerVerifier
            (this_00,(Functions *)CONCAT44(extraout_var_00,iVar2),
             ((this->super_TestCaseGroup).m_context)->m_testCtx->m_log);
  this->m_verifierInteger = this_00;
  this_01 = (GetInteger64Verifier *)operator_new(0x28);
  iVar2 = (*((this->super_TestCaseGroup).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  FloatStateQueryVerifiers::GetInteger64Verifier::GetInteger64Verifier
            (this_01,(Functions *)CONCAT44(extraout_var_01,iVar2),
             ((this->super_TestCaseGroup).m_context)->m_testCtx->m_log);
  this->m_verifierInteger64 = this_01;
  this_02 = (GetFloatVerifier *)operator_new(0x28);
  iVar2 = (*((this->super_TestCaseGroup).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  FloatStateQueryVerifiers::GetFloatVerifier::GetFloatVerifier
            (this_02,(Functions *)CONCAT44(extraout_var_02,iVar2),
             ((this->super_TestCaseGroup).m_context)->m_testCtx->m_log);
  this->m_verifierFloat = this_02;
  local_58 = this->m_verifierBoolean;
  pGStack_50 = this->m_verifierInteger;
  local_48 = this->m_verifierInteger64;
  local_40 = this_02;
  for (local_a0 = 0; local_a0 != 4; local_a0 = local_a0 + 1) {
    pGVar3 = (&local_58)[local_a0];
    pAVar4 = (ApiCase *)operator_new(0xa0);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"depth_range",&local_a1);
    std::operator+(&local_98,&local_78,(pGVar3->super_StateVerifier).m_testNamePostfix);
    ApiCase::ApiCase(pAVar4,pCVar1,local_98._M_dataplus._M_p,"DEPTH_RANGE");
    (pAVar4->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_01e3d760;
    pAVar4[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar3;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar4);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_78);
  }
  for (local_a0 = 0; local_a0 != 4; local_a0 = local_a0 + 1) {
    pGVar3 = (&local_58)[local_a0];
    pAVar4 = (ApiCase *)operator_new(0xa0);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"line_width",&local_a1);
    std::operator+(&local_98,&local_78,(pGVar3->super_StateVerifier).m_testNamePostfix);
    ApiCase::ApiCase(pAVar4,pCVar1,local_98._M_dataplus._M_p,"LINE_WIDTH");
    (pAVar4->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_01e3d7b8;
    pAVar4[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar3;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar4);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_78);
  }
  for (local_a0 = 0; local_a0 != 4; local_a0 = local_a0 + 1) {
    pGVar3 = (&local_58)[local_a0];
    pAVar4 = (ApiCase *)operator_new(0xa0);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"polygon_offset_factor",&local_a1);
    std::operator+(&local_98,&local_78,(pGVar3->super_StateVerifier).m_testNamePostfix);
    ApiCase::ApiCase(pAVar4,pCVar1,local_98._M_dataplus._M_p,"POLYGON_OFFSET_FACTOR");
    (pAVar4->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_01e3d810;
    pAVar4[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar3;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar4);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_78);
  }
  for (local_a0 = 0; local_a0 != 4; local_a0 = local_a0 + 1) {
    pGVar3 = (&local_58)[local_a0];
    pAVar4 = (ApiCase *)operator_new(0xa0);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"polygon_offset_units",&local_a1);
    std::operator+(&local_98,&local_78,(pGVar3->super_StateVerifier).m_testNamePostfix);
    ApiCase::ApiCase(pAVar4,pCVar1,local_98._M_dataplus._M_p,"POLYGON_OFFSET_UNITS");
    (pAVar4->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_01e3d868;
    pAVar4[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar3;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar4);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_78);
  }
  for (local_a0 = 0; local_a0 != 4; local_a0 = local_a0 + 1) {
    pGVar3 = (&local_58)[local_a0];
    pAVar4 = (ApiCase *)operator_new(0xa0);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"sample_coverage_value",&local_a1);
    std::operator+(&local_98,&local_78,(pGVar3->super_StateVerifier).m_testNamePostfix);
    ApiCase::ApiCase(pAVar4,pCVar1,local_98._M_dataplus._M_p,"SAMPLE_COVERAGE_VALUE");
    (pAVar4->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_01e3d8c0;
    pAVar4[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar3;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar4);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_78);
  }
  for (local_a0 = 0; local_a0 != 4; local_a0 = local_a0 + 1) {
    pGVar3 = (&local_58)[local_a0];
    pAVar4 = (ApiCase *)operator_new(0xa0);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"blend_color",&local_a1);
    std::operator+(&local_98,&local_78,(pGVar3->super_StateVerifier).m_testNamePostfix);
    ApiCase::ApiCase(pAVar4,pCVar1,local_98._M_dataplus._M_p,"BLEND_COLOR");
    (pAVar4->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_01e3d918;
    pAVar4[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar3;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar4);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_78);
  }
  for (local_a0 = 0; local_a0 != 4; local_a0 = local_a0 + 1) {
    pGVar3 = (&local_58)[local_a0];
    pAVar4 = (ApiCase *)operator_new(0xa0);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"color_clear_value",&local_a1);
    std::operator+(&local_98,&local_78,(pGVar3->super_StateVerifier).m_testNamePostfix);
    ApiCase::ApiCase(pAVar4,pCVar1,local_98._M_dataplus._M_p,"COLOR_CLEAR_VALUE");
    (pAVar4->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_01e3d970;
    pAVar4[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar3;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar4);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_78);
  }
  for (local_a0 = 0; local_a0 != 4; local_a0 = local_a0 + 1) {
    pGVar3 = (&local_58)[local_a0];
    pAVar4 = (ApiCase *)operator_new(0xa0);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"depth_clear_value",&local_a1);
    std::operator+(&local_98,&local_78,(pGVar3->super_StateVerifier).m_testNamePostfix);
    ApiCase::ApiCase(pAVar4,pCVar1,local_98._M_dataplus._M_p,"DEPTH_CLEAR_VALUE");
    (pAVar4->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_01e3d9c8;
    pAVar4[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar3;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar4);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_78);
  }
  for (local_a0 = 0; local_a0 != 4; local_a0 = local_a0 + 1) {
    pGVar3 = (&local_58)[local_a0];
    pAVar4 = (ApiCase *)operator_new(0xa0);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"max_texture_lod_bias",&local_a1);
    std::operator+(&local_98,&local_78,(pGVar3->super_StateVerifier).m_testNamePostfix);
    ApiCase::ApiCase(pAVar4,pCVar1,local_98._M_dataplus._M_p,"MAX_TEXTURE_LOD_BIAS");
    (pAVar4->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_01e3da20;
    pAVar4[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar3;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar4);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_78);
  }
  for (local_a0 = 0; local_a0 != 4; local_a0 = local_a0 + 1) {
    pGVar3 = (&local_58)[local_a0];
    pAVar4 = (ApiCase *)operator_new(0xa0);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"aliased_point_size_range",&local_a1);
    std::operator+(&local_98,&local_78,(pGVar3->super_StateVerifier).m_testNamePostfix);
    ApiCase::ApiCase(pAVar4,pCVar1,local_98._M_dataplus._M_p,"ALIASED_POINT_SIZE_RANGE");
    (pAVar4->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_01e3da78;
    pAVar4[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar3;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar4);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_78);
  }
  for (local_a0 = 0; local_a0 != 4; local_a0 = local_a0 + 1) {
    pGVar3 = (&local_58)[local_a0];
    pAVar4 = (ApiCase *)operator_new(0xa0);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"aliased_line_width_range",&local_a1);
    std::operator+(&local_98,&local_78,(pGVar3->super_StateVerifier).m_testNamePostfix);
    ApiCase::ApiCase(pAVar4,pCVar1,local_98._M_dataplus._M_p,"ALIASED_LINE_WIDTH_RANGE");
    (pAVar4->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_01e3dad0;
    pAVar4[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar3;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar4);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_78);
  }
  return 4;
}

Assistant:

void FloatStateQueryTests::init (void)
{
	DE_ASSERT(m_verifierBoolean == DE_NULL);
	DE_ASSERT(m_verifierInteger == DE_NULL);
	DE_ASSERT(m_verifierInteger64 == DE_NULL);
	DE_ASSERT(m_verifierFloat == DE_NULL);

	m_verifierBoolean		= new GetBooleanVerifier	(m_context.getRenderContext().getFunctions(), m_context.getTestContext().getLog());
	m_verifierInteger		= new GetIntegerVerifier	(m_context.getRenderContext().getFunctions(), m_context.getTestContext().getLog());
	m_verifierInteger64		= new GetInteger64Verifier	(m_context.getRenderContext().getFunctions(), m_context.getTestContext().getLog());
	m_verifierFloat			= new GetFloatVerifier		(m_context.getRenderContext().getFunctions(), m_context.getTestContext().getLog());

	StateVerifier* verifiers[] = {m_verifierBoolean, m_verifierInteger, m_verifierInteger64, m_verifierFloat};

	FOR_EACH_VERIFIER(verifiers, addChild(new DepthRangeCase				(m_context, verifier,	(std::string("depth_range")					+ verifier->getTestNamePostfix()).c_str(),	"DEPTH_RANGE")));
	FOR_EACH_VERIFIER(verifiers, addChild(new LineWidthCase					(m_context, verifier,	(std::string("line_width")					+ verifier->getTestNamePostfix()).c_str(),	"LINE_WIDTH")));
	FOR_EACH_VERIFIER(verifiers, addChild(new PolygonOffsetFactorCase		(m_context, verifier,	(std::string("polygon_offset_factor")		+ verifier->getTestNamePostfix()).c_str(),	"POLYGON_OFFSET_FACTOR")));
	FOR_EACH_VERIFIER(verifiers, addChild(new PolygonOffsetUnitsCase		(m_context, verifier,	(std::string("polygon_offset_units")		+ verifier->getTestNamePostfix()).c_str(),	"POLYGON_OFFSET_UNITS")));
	FOR_EACH_VERIFIER(verifiers, addChild(new SampleCoverageCase			(m_context, verifier,	(std::string("sample_coverage_value")		+ verifier->getTestNamePostfix()).c_str(),	"SAMPLE_COVERAGE_VALUE")));
	FOR_EACH_VERIFIER(verifiers, addChild(new BlendColorCase				(m_context, verifier,	(std::string("blend_color")					+ verifier->getTestNamePostfix()).c_str(),	"BLEND_COLOR")));
	FOR_EACH_VERIFIER(verifiers, addChild(new ColorClearCase				(m_context, verifier,	(std::string("color_clear_value")			+ verifier->getTestNamePostfix()).c_str(),	"COLOR_CLEAR_VALUE")));
	FOR_EACH_VERIFIER(verifiers, addChild(new DepthClearCase				(m_context, verifier,	(std::string("depth_clear_value")			+ verifier->getTestNamePostfix()).c_str(),	"DEPTH_CLEAR_VALUE")));
	FOR_EACH_VERIFIER(verifiers, addChild(new MaxTextureLODBiasCase			(m_context, verifier,	(std::string("max_texture_lod_bias")		+ verifier->getTestNamePostfix()).c_str(),	"MAX_TEXTURE_LOD_BIAS")));
	FOR_EACH_VERIFIER(verifiers, addChild(new AliasedPointSizeRangeCase		(m_context, verifier,	(std::string("aliased_point_size_range")	+ verifier->getTestNamePostfix()).c_str(),	"ALIASED_POINT_SIZE_RANGE")));
	FOR_EACH_VERIFIER(verifiers, addChild(new AliasedLineWidthRangeCase		(m_context, verifier,	(std::string("aliased_line_width_range")	+ verifier->getTestNamePostfix()).c_str(),	"ALIASED_LINE_WIDTH_RANGE")));
}